

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

void Corrade::Utility::Implementation::flipSecondToLastDimensionInPlace
               (StridedArrayView4D<char> *view)

{
  bool bVar1;
  ostream *output;
  type this;
  type this_00;
  ulong uVar2;
  StridedArrayView<4U,_char> *in_RDI;
  size_t remainingSize;
  size_t i3Max;
  size_t i3;
  char *ptr3Right;
  char *ptr3Left;
  char tmp [32];
  size_t BlockSize;
  char *ptr2Right;
  char *ptr2Left;
  size_t i2Max;
  size_t i2;
  char *ptr1;
  size_t i1;
  char *ptr0;
  size_t i0;
  ptrdiff_t *stride;
  size_t *size;
  char *ptr;
  ulong local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  ulong local_c0;
  ulong local_b8;
  ErasedType *local_b0;
  unsigned_long local_a8;
  ErasedType *local_a0;
  unsigned_long local_98;
  long *local_90;
  unsigned_long *local_88;
  ErasedType *local_80;
  Flags local_61;
  Error local_60;
  StridedArrayView<4U,_char> *local_38;
  
  local_38 = in_RDI;
  bVar1 = Containers::StridedArrayView<4u,char>::isContiguous<3u>
                    ((StridedArrayView<4u,char> *)in_RDI);
  if (!bVar1) {
    output = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_61);
    Error::Error(&local_60,output,local_61);
    Debug::operator<<(&local_60.super_Debug,
                      "Assertion view.isContiguous<3>() failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Algorithms.cpp:232"
                     );
    Error::~Error(&local_60);
    abort();
  }
  local_80 = Containers::StridedArrayView<4U,_char>::data(local_38);
  this = Containers::StridedArrayView<4U,_char>::size(local_38);
  local_88 = Containers::StridedDimensions<4U,_unsigned_long>::begin(this);
  this_00 = Containers::StridedArrayView<4U,_char>::stride(local_38);
  local_90 = Containers::StridedDimensions<4U,_long>::begin(this_00);
  for (local_98 = 0; local_98 != *local_88; local_98 = local_98 + 1) {
    local_a0 = (ErasedType *)((long)local_80 + local_98 * *local_90);
    for (local_a8 = 0; local_a8 != local_88[1]; local_a8 = local_a8 + 1) {
      local_b0 = (ErasedType *)((long)local_a0 + local_a8 * local_90[1]);
      local_b8 = 0;
      local_c0 = local_88[2] >> 1;
      for (; local_b8 != local_c0; local_b8 = local_b8 + 1) {
        local_c8 = (undefined8 *)((long)local_b0 + local_b8 * local_90[2]);
        local_d0 = (undefined8 *)((long)local_b0 + ((local_88[2] - local_b8) + -1) * local_90[2]);
        local_d8 = 0x20;
        local_118 = 0;
        uVar2 = local_88[3];
        local_110 = local_d0;
        local_108 = local_c8;
        for (; local_118 != uVar2 >> 5; local_118 = local_118 + 1) {
          local_100 = *local_108;
          local_f8 = local_108[1];
          local_f0 = local_108[2];
          local_e8 = local_108[3];
          *local_108 = *local_110;
          local_108[1] = local_110[1];
          local_108[2] = local_110[2];
          local_108[3] = local_110[3];
          *local_110 = local_100;
          local_110[1] = local_f8;
          local_110[2] = local_f0;
          local_110[3] = local_e8;
          local_108 = local_108 + 4;
          local_110 = local_110 + 4;
        }
        uVar2 = local_88[3] & 0x1f;
        memcpy(&local_100,local_108,uVar2);
        memcpy(local_108,local_110,uVar2);
        memcpy(local_110,&local_100,uVar2);
      }
    }
  }
  return;
}

Assistant:

void flipSecondToLastDimensionInPlace(const Containers::StridedArrayView4D<char>& view) {
    /* Should have been checked by flipInPlace() already, just verifying that
       all the bubbling back to four dimensions went correct */
    CORRADE_INTERNAL_ASSERT(view.isContiguous<3>());

    auto* const ptr = static_cast<char*>(view.data());
    const std::size_t* size = view.size().begin();
    const std::ptrdiff_t* stride = view.stride().begin();

    for(std::size_t i0 = 0; i0 != size[0]; ++i0) {
        char* const ptr0 = ptr + i0*stride[0];
        for(std::size_t i1 = 0; i1 != size[1]; ++i1) {
            char* const ptr1 = ptr0 + i1*stride[1];

            /* Go through half of the items in third dimension and flip them
               with the other half */
            for(std::size_t i2 = 0, i2Max = size[2]/2; i2 != i2Max; ++i2) {
                char* const ptr2Left = ptr1 + i2*stride[2];
                char* const ptr2Right = ptr1 + (size[2] - i2 - 1)*stride[2];

                /* Copy 256-bit blocks at a time, which could hopefully make
                   use of 256-bit SIMD */
                constexpr std::size_t BlockSize = 32;
                alignas(BlockSize) char tmp[BlockSize];
                char* ptr3Left = ptr2Left;
                char* ptr3Right = ptr2Right;
                for(std::size_t i3 = 0, i3Max = size[3]/BlockSize; i3 != i3Max; ++i3) {
                    std::memcpy(tmp, ptr3Left, BlockSize);
                    std::memcpy(ptr3Left, ptr3Right, BlockSize);
                    std::memcpy(ptr3Right, tmp, BlockSize);

                    ptr3Left += BlockSize;
                    ptr3Right += BlockSize;
                }

                /* Copy the rest. I doubt an if() around this makes sense,
                   since it would slow down the very common and very slow case
                   where we're flipping pieces of data smaller than 256 bits */
                const std::size_t remainingSize = size[3]%BlockSize;
                std::memcpy(tmp, ptr3Left, remainingSize);
                std::memcpy(ptr3Left, ptr3Right, remainingSize);
                std::memcpy(ptr3Right, tmp, remainingSize);
            }
        }
    }
}